

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::FboStateQueryTests::init(FboStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  int extraout_EAX;
  DefaultFramebufferCase *this_00;
  char *pcVar1;
  TestNode *pTVar2;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  int local_3c;
  char *pcStack_38;
  int ndx;
  FramebufferTarget fboTargets [2];
  FboStateQueryTests *this_local;
  
  pcStack_38 = "draw_framebuffer_";
  fboTargets[0].name = (char *)0x8ca9;
  fboTargets[0]._8_8_ = anon_var_dwarf_15054e5;
  fboTargets[1].name = (char *)0x8ca8;
  for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
    this_00 = (DefaultFramebufferCase *)operator_new(0xa0);
    context = (this->super_TestCaseGroup).m_context;
    pcVar1 = *(char **)&fboTargets[(long)local_3c + -1].target;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar1,&local_81);
    std::operator+(&local_60,&local_80,"default_framebuffer");
    pcVar1 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::DefaultFramebufferCase::DefaultFramebufferCase
              (this_00,context,pcVar1,"default framebuffer",*(GLenum *)&fboTargets[local_3c].name);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  pTVar2 = (TestNode *)operator_new(0x98);
  anon_unknown_1::AttachmentObjectCase::AttachmentObjectCase
            ((AttachmentObjectCase *)pTVar2,(this->super_TestCaseGroup).m_context,
             "framebuffer_attachment_object",
             "FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE and FRAMEBUFFER_ATTACHMENT_OBJECT_NAME");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  anon_unknown_1::AttachmentTextureLevelCase::AttachmentTextureLevelCase
            ((AttachmentTextureLevelCase *)pTVar2,(this->super_TestCaseGroup).m_context,
             "framebuffer_attachment_texture_level","FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  anon_unknown_1::AttachmentTextureCubeMapFaceCase::AttachmentTextureCubeMapFaceCase
            ((AttachmentTextureCubeMapFaceCase *)pTVar2,(this->super_TestCaseGroup).m_context,
             "framebuffer_attachment_texture_cube_map_face",
             "FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  anon_unknown_1::AttachmentTextureLayerCase::AttachmentTextureLayerCase
            ((AttachmentTextureLayerCase *)pTVar2,(this->super_TestCaseGroup).m_context,
             "framebuffer_attachment_texture_layer","FRAMEBUFFER_ATTACHMENT_TEXTURE_LAYER");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  anon_unknown_1::AttachmentTextureColorCodingCase::AttachmentTextureColorCodingCase
            ((AttachmentTextureColorCodingCase *)pTVar2,(this->super_TestCaseGroup).m_context,
             "framebuffer_attachment_color_encoding","FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  anon_unknown_1::AttachmentTextureComponentTypeCase::AttachmentTextureComponentTypeCase
            ((AttachmentTextureComponentTypeCase *)pTVar2,(this->super_TestCaseGroup).m_context,
             "framebuffer_attachment_component_type","FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  anon_unknown_1::AttachmentSizeInitialCase::AttachmentSizeInitialCase
            ((AttachmentSizeInitialCase *)pTVar2,(this->super_TestCaseGroup).m_context,
             "framebuffer_attachment_x_size_initial","FRAMEBUFFER_ATTACHMENT_x_SIZE");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  anon_unknown_1::AttachmentSizeRboCase::AttachmentSizeRboCase
            ((AttachmentSizeRboCase *)pTVar2,(this->super_TestCaseGroup).m_context,
             "framebuffer_attachment_x_size_rbo","FRAMEBUFFER_ATTACHMENT_x_SIZE");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  anon_unknown_1::AttachmentSizeTextureCase::AttachmentSizeTextureCase
            ((AttachmentSizeTextureCase *)pTVar2,(this->super_TestCaseGroup).m_context,
             "framebuffer_attachment_x_size_texture","FRAMEBUFFER_ATTACHMENT_x_SIZE");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  anon_unknown_1::UnspecifiedAttachmentTextureColorCodingCase::
  UnspecifiedAttachmentTextureColorCodingCase
            ((UnspecifiedAttachmentTextureColorCodingCase *)pTVar2,
             (this->super_TestCaseGroup).m_context,
             "framebuffer_unspecified_attachment_color_encoding",
             "FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  anon_unknown_1::UnspecifiedAttachmentTextureComponentTypeCase::
  UnspecifiedAttachmentTextureComponentTypeCase
            ((UnspecifiedAttachmentTextureComponentTypeCase *)pTVar2,
             (this->super_TestCaseGroup).m_context,
             "framebuffer_unspecified_attachment_component_type",
             "FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  anon_unknown_1::UnspecifiedAttachmentSizeRboCase::UnspecifiedAttachmentSizeRboCase
            ((UnspecifiedAttachmentSizeRboCase *)pTVar2,(this->super_TestCaseGroup).m_context,
             "framebuffer_unspecified_attachment_x_size_rbo","FRAMEBUFFER_ATTACHMENT_x_SIZE");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  anon_unknown_1::UnspecifiedAttachmentSizeTextureCase::UnspecifiedAttachmentSizeTextureCase
            ((UnspecifiedAttachmentSizeTextureCase *)pTVar2,(this->super_TestCaseGroup).m_context,
             "framebuffer_unspecified_attachment_x_size_texture","FRAMEBUFFER_ATTACHMENT_x_SIZE");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void FboStateQueryTests::init (void)
{
	const struct FramebufferTarget
	{
		const char*	name;
		GLenum		target;
	} fboTargets[] =
	{
		{ "draw_framebuffer_", GL_DRAW_FRAMEBUFFER },
		{ "read_framebuffer_", GL_READ_FRAMEBUFFER }
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(fboTargets); ++ndx)
		addChild(new DefaultFramebufferCase(m_context, (std::string(fboTargets[ndx].name) + "default_framebuffer").c_str(), "default framebuffer", fboTargets[ndx].target));

	addChild(new AttachmentObjectCase							(m_context, "framebuffer_attachment_object",							"FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE and FRAMEBUFFER_ATTACHMENT_OBJECT_NAME"));
	addChild(new AttachmentTextureLevelCase						(m_context, "framebuffer_attachment_texture_level",						"FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL"));
	addChild(new AttachmentTextureCubeMapFaceCase				(m_context, "framebuffer_attachment_texture_cube_map_face",				"FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE"));
	addChild(new AttachmentTextureLayerCase						(m_context, "framebuffer_attachment_texture_layer",						"FRAMEBUFFER_ATTACHMENT_TEXTURE_LAYER"));
	addChild(new AttachmentTextureColorCodingCase				(m_context, "framebuffer_attachment_color_encoding",					"FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING"));
	addChild(new AttachmentTextureComponentTypeCase				(m_context, "framebuffer_attachment_component_type",					"FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE"));
	addChild(new AttachmentSizeInitialCase						(m_context, "framebuffer_attachment_x_size_initial",					"FRAMEBUFFER_ATTACHMENT_x_SIZE"));
	addChild(new AttachmentSizeRboCase							(m_context, "framebuffer_attachment_x_size_rbo",						"FRAMEBUFFER_ATTACHMENT_x_SIZE"));
	addChild(new AttachmentSizeTextureCase						(m_context, "framebuffer_attachment_x_size_texture",					"FRAMEBUFFER_ATTACHMENT_x_SIZE"));

	addChild(new UnspecifiedAttachmentTextureColorCodingCase	(m_context, "framebuffer_unspecified_attachment_color_encoding",		"FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING"));
	addChild(new UnspecifiedAttachmentTextureComponentTypeCase	(m_context, "framebuffer_unspecified_attachment_component_type",		"FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE"));
	addChild(new UnspecifiedAttachmentSizeRboCase				(m_context, "framebuffer_unspecified_attachment_x_size_rbo",			"FRAMEBUFFER_ATTACHMENT_x_SIZE"));
	addChild(new UnspecifiedAttachmentSizeTextureCase			(m_context, "framebuffer_unspecified_attachment_x_size_texture",		"FRAMEBUFFER_ATTACHMENT_x_SIZE"));
}